

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_or_16_er_pi(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint res;
  
  uVar1 = OPER_AY_PI_16();
  uVar3 = m68ki_cpu.ir >> 9 & 7;
  uVar2 = uVar1 | m68ki_cpu.dar[uVar3];
  m68ki_cpu.dar[uVar3] = uVar2;
  m68ki_cpu.not_z_flag = uVar2 & 0xffff;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 8;
  m68ki_cpu.c_flag = 0;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_or_16_er_pi(void)
{
	uint res = MASK_OUT_ABOVE_16((DX |= OPER_AY_PI_16()));

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}